

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_marker(stbi__jpeg *z,int m)

{
  stbi__context *psVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  uchar *puVar4;
  byte bVar5;
  stbi_uc sVar6;
  sbyte sVar7;
  uchar uVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  char *pcVar13;
  stbi_uc *psVar14;
  int i_1;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  byte bVar20;
  int ok;
  long in_FS_OFFSET;
  bool bVar21;
  int sizes [16];
  uint local_78 [18];
  int iVar12;
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      uVar11 = stbi__get16be(z->s);
      iVar19 = uVar11 - 2;
      if (2 < uVar11) {
        do {
          psVar1 = z->s;
          pbVar2 = psVar1->img_buffer;
          if (pbVar2 < psVar1->img_buffer_end) {
            psVar1->img_buffer = pbVar2 + 1;
            bVar9 = *pbVar2;
          }
          else if (psVar1->read_from_callbacks == 0) {
            bVar9 = 0;
          }
          else {
            psVar3 = psVar1->buffer_start;
            iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
            psVar1->callback_already_read =
                 psVar1->callback_already_read +
                 (*(int *)&psVar1->img_buffer - *(int *)&psVar1->img_buffer_original);
            if (iVar12 == 0) {
              psVar1->read_from_callbacks = 0;
              psVar14 = psVar1->buffer_start + 1;
              psVar1->buffer_start[0] = '\0';
              bVar9 = 0;
            }
            else {
              psVar14 = psVar3 + iVar12;
              bVar9 = *psVar3;
            }
            psVar1->img_buffer_end = psVar14;
            psVar1->img_buffer = psVar1->buffer_start + 1;
          }
          if ((0x1f < bVar9) || (bVar20 = bVar9 & 0xf, 3 < bVar20)) {
            pcVar13 = "bad DHT header";
            goto LAB_00128773;
          }
          lVar15 = 0;
          uVar11 = 0;
          do {
            psVar1 = z->s;
            pbVar2 = psVar1->img_buffer;
            if (pbVar2 < psVar1->img_buffer_end) {
              psVar1->img_buffer = pbVar2 + 1;
              bVar5 = *pbVar2;
            }
            else if (psVar1->read_from_callbacks == 0) {
              bVar5 = 0;
            }
            else {
              psVar3 = psVar1->buffer_start;
              iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
              psVar1->callback_already_read =
                   psVar1->callback_already_read +
                   (*(int *)&psVar1->img_buffer - *(int *)&psVar1->img_buffer_original);
              if (iVar12 == 0) {
                psVar1->read_from_callbacks = 0;
                psVar14 = psVar1->buffer_start + 1;
                psVar1->buffer_start[0] = '\0';
                bVar5 = 0;
              }
              else {
                psVar14 = psVar3 + iVar12;
                bVar5 = *psVar3;
              }
              psVar1->img_buffer_end = psVar14;
              psVar1->img_buffer = psVar1->buffer_start + 1;
            }
            local_78[lVar15] = (uint)bVar5;
            uVar11 = uVar11 + bVar5;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          if (bVar9 < 0x10) {
            iVar12 = stbi__build_huffman(z->huff_dc + bVar20,(int *)local_78);
            lVar15 = 8;
          }
          else {
            iVar12 = stbi__build_huffman(z->huff_ac + bVar20,(int *)local_78);
            lVar15 = 0x1a48;
          }
          if (iVar12 == 0) goto LAB_0012877c;
          if (uVar11 != 0) {
            uVar16 = 0;
            do {
              psVar1 = z->s;
              psVar3 = psVar1->img_buffer;
              if (psVar3 < psVar1->img_buffer_end) {
                psVar1->img_buffer = psVar3 + 1;
                sVar6 = *psVar3;
              }
              else if (psVar1->read_from_callbacks == 0) {
                sVar6 = '\0';
              }
              else {
                psVar3 = psVar1->buffer_start;
                iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
                psVar1->callback_already_read =
                     psVar1->callback_already_read +
                     (*(int *)&psVar1->img_buffer - *(int *)&psVar1->img_buffer_original);
                if (iVar12 == 0) {
                  psVar1->read_from_callbacks = 0;
                  psVar14 = psVar1->buffer_start + 1;
                  psVar1->buffer_start[0] = '\0';
                  sVar6 = '\0';
                }
                else {
                  psVar14 = psVar3 + iVar12;
                  sVar6 = *psVar3;
                }
                psVar1->img_buffer_end = psVar14;
                psVar1->img_buffer = psVar1->buffer_start + 1;
              }
              z->huff_dc[bVar20].values[uVar16 + lVar15 + -8] = sVar6;
              uVar16 = uVar16 + 1;
            } while (uVar11 != uVar16);
          }
          if (0xf < bVar9) {
            lVar15 = 0;
            do {
              uVar16 = (ulong)z->huff_ac[bVar20].fast[lVar15];
              z->fast_ac[bVar20][lVar15] = 0;
              if (uVar16 != 0xff) {
                bVar9 = z->huff_ac[bVar20].values[uVar16];
                if ((bVar9 & 0xf) != 0) {
                  bVar5 = z->huff_ac[bVar20].size[uVar16];
                  uVar10 = (bVar9 & 0xf) + (ushort)bVar5;
                  if (uVar10 < 10) {
                    uVar18 = (int)lVar15 << (bVar5 & 0x1f) & 0x1ff;
                    sVar7 = (sbyte)(bVar9 & 0xf);
                    uVar17 = -1 << sVar7 | 1;
                    if (0xff < uVar18) {
                      uVar17 = 0;
                    }
                    iVar12 = uVar17 + (uVar18 >> (9U - sVar7 & 0x1f));
                    if ((char)iVar12 == iVar12) {
                      z->fast_ac[bVar20][lVar15] = (short)iVar12 * 0x100 | bVar9 & 0xfff0 | uVar10;
                    }
                  }
                }
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x200);
          }
          iVar19 = (iVar19 + -0x11) - uVar11;
        } while (0 < iVar19);
      }
    }
    else {
      if (m != 0xdb) {
LAB_00128277:
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          uVar11 = stbi__get16be(z->s);
          if (1 < uVar11) {
            if (uVar11 < 7 || m != 0xe0) {
              if (uVar11 < 0xe || m != 0xee) {
                iVar19 = uVar11 - 2;
              }
              else {
                bVar21 = true;
                lVar15 = 0;
                do {
                  psVar1 = z->s;
                  puVar4 = psVar1->img_buffer;
                  if (puVar4 < psVar1->img_buffer_end) {
                    psVar1->img_buffer = puVar4 + 1;
                    uVar8 = *puVar4;
                  }
                  else if (psVar1->read_from_callbacks == 0) {
                    uVar8 = '\0';
                  }
                  else {
                    psVar3 = psVar1->buffer_start;
                    iVar19 = (*(psVar1->io).read)
                                       (psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
                    psVar1->callback_already_read =
                         psVar1->callback_already_read +
                         (*(int *)&psVar1->img_buffer - *(int *)&psVar1->img_buffer_original);
                    if (iVar19 == 0) {
                      psVar1->read_from_callbacks = 0;
                      psVar14 = psVar1->buffer_start + 1;
                      psVar1->buffer_start[0] = '\0';
                      uVar8 = '\0';
                    }
                    else {
                      psVar14 = psVar3 + iVar19;
                      uVar8 = *psVar3;
                    }
                    psVar1->img_buffer_end = psVar14;
                    psVar1->img_buffer = psVar1->buffer_start + 1;
                  }
                  if (uVar8 != "Adobe"[lVar15]) {
                    bVar21 = false;
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 6);
                if (bVar21) {
                  stbi__get8(z->s);
                  stbi__get16be(z->s);
                  stbi__get16be(z->s);
                  bVar9 = stbi__get8(z->s);
                  z->app14_color_transform = (uint)bVar9;
                  iVar19 = uVar11 - 0xe;
                }
                else {
                  iVar19 = uVar11 - 8;
                }
              }
            }
            else {
              bVar21 = true;
              lVar15 = 0;
              do {
                psVar1 = z->s;
                puVar4 = psVar1->img_buffer;
                if (puVar4 < psVar1->img_buffer_end) {
                  psVar1->img_buffer = puVar4 + 1;
                  uVar8 = *puVar4;
                }
                else if (psVar1->read_from_callbacks == 0) {
                  uVar8 = '\0';
                }
                else {
                  psVar3 = psVar1->buffer_start;
                  iVar19 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
                  psVar1->callback_already_read =
                       psVar1->callback_already_read +
                       (*(int *)&psVar1->img_buffer - *(int *)&psVar1->img_buffer_original);
                  if (iVar19 == 0) {
                    psVar1->read_from_callbacks = 0;
                    psVar14 = psVar1->buffer_start + 1;
                    psVar1->buffer_start[0] = '\0';
                    uVar8 = '\0';
                  }
                  else {
                    psVar14 = psVar3 + iVar19;
                    uVar8 = *psVar3;
                  }
                  psVar1->img_buffer_end = psVar14;
                  psVar1->img_buffer = psVar1->buffer_start + 1;
                }
                if (uVar8 != "JFIF"[lVar15]) {
                  bVar21 = false;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 != 5);
              iVar19 = uVar11 - 7;
              if (bVar21) {
                z->jfif = 1;
              }
            }
            stbi__skip(z->s,iVar19);
            goto LAB_00128898;
          }
          if (m == 0xfe) {
            pcVar13 = "bad COM len";
          }
          else {
            pcVar13 = "bad APP len";
          }
        }
        else {
          pcVar13 = "unknown marker";
        }
        goto LAB_00128773;
      }
      uVar11 = stbi__get16be(z->s);
      iVar19 = uVar11 - 2;
      if (2 < uVar11) {
        do {
          psVar1 = z->s;
          pbVar2 = psVar1->img_buffer;
          if (pbVar2 < psVar1->img_buffer_end) {
            psVar1->img_buffer = pbVar2 + 1;
            bVar9 = *pbVar2;
LAB_00128128:
            bVar21 = 0xf < bVar9;
            if ((bVar9 & 0xfffffff0) != 0x10 && bVar21) {
              pcVar13 = "bad DQT type";
              goto LAB_00128773;
            }
            uVar11 = bVar9 & 0xf;
            if (3 < uVar11) {
              pcVar13 = "bad DQT table";
              goto LAB_00128773;
            }
          }
          else {
            if (psVar1->read_from_callbacks != 0) {
              psVar3 = psVar1->buffer_start;
              iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
              psVar1->callback_already_read =
                   psVar1->callback_already_read +
                   (*(int *)&psVar1->img_buffer - *(int *)&psVar1->img_buffer_original);
              if (iVar12 == 0) {
                psVar1->read_from_callbacks = 0;
                psVar14 = psVar1->buffer_start + 1;
                psVar1->buffer_start[0] = '\0';
                bVar9 = 0;
              }
              else {
                psVar14 = psVar3 + iVar12;
                bVar9 = *psVar3;
              }
              psVar1->img_buffer_end = psVar14;
              psVar1->img_buffer = psVar1->buffer_start + 1;
              goto LAB_00128128;
            }
            bVar21 = false;
            uVar11 = 0;
          }
          lVar15 = 0;
          do {
            psVar1 = z->s;
            if (bVar21 == false) {
              pbVar2 = psVar1->img_buffer;
              if (pbVar2 < psVar1->img_buffer_end) {
                psVar1->img_buffer = pbVar2 + 1;
                bVar9 = *pbVar2;
              }
              else if (psVar1->read_from_callbacks == 0) {
                bVar9 = 0;
              }
              else {
                psVar3 = psVar1->buffer_start;
                iVar12 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
                psVar1->callback_already_read =
                     psVar1->callback_already_read +
                     (*(int *)&psVar1->img_buffer - *(int *)&psVar1->img_buffer_original);
                if (iVar12 == 0) {
                  psVar1->read_from_callbacks = 0;
                  psVar14 = psVar1->buffer_start + 1;
                  psVar1->buffer_start[0] = '\0';
                  bVar9 = 0;
                }
                else {
                  psVar14 = psVar3 + iVar12;
                  bVar9 = *psVar3;
                }
                psVar1->img_buffer_end = psVar14;
                psVar1->img_buffer = psVar1->buffer_start + 1;
              }
              uVar10 = (ushort)bVar9;
            }
            else {
              iVar12 = stbi__get16be(psVar1);
              uVar10 = (ushort)iVar12;
            }
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar15] * 2 + (ulong)(uVar11 << 7)) = uVar10
            ;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x40);
          iVar19 = iVar19 + (uint)(bVar21 ^ 1) * 0x40 + -0x81;
        } while (0 < iVar19);
      }
    }
    bVar21 = iVar19 == 0;
  }
  else {
    if (m == 0xdd) {
      iVar19 = stbi__get16be(z->s);
      if (iVar19 == 4) {
        iVar19 = stbi__get16be(z->s);
        z->restart_interval = iVar19;
LAB_00128898:
        bVar21 = true;
        goto LAB_0012889a;
      }
      pcVar13 = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_00128277;
      pcVar13 = "expected marker";
    }
LAB_00128773:
    *(char **)(in_FS_OFFSET + -8) = pcVar13;
LAB_0012877c:
    bVar21 = false;
  }
LAB_0012889a:
  return (int)bVar21;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}